

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

Publisher __thiscall miniros::NodeHandle::advertise(NodeHandle *this,AdvertiseOptions *ops)

{
  byte bVar1;
  CallbackQueue *pCVar2;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CallbackQueueInterface **in_RSI;
  element_type *in_RDI;
  Publisher PVar3;
  scoped_lock<std::mutex> lock;
  SubscriberCallbacksPtr callbacks;
  Publisher *pub;
  SubscriberCallbacksPtr *in_stack_00000678;
  AdvertiseOptions *in_stack_00000680;
  TopicManager *in_stack_00000688;
  mutex_type *in_stack_ffffffffffffff48;
  shared_ptr<miniros::Publisher::Impl> *__r;
  scoped_lock<std::mutex> *in_stack_ffffffffffffff50;
  vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
  *this_00;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffff80;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  NodeHandle *in_stack_ffffffffffffffa0;
  NodeHandle *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  Publisher *in_stack_ffffffffffffffc0;
  string local_38 [32];
  string *local_18;
  
  local_18 = in_RDX;
  resolveName(in_stack_ffffffffffffffa8,&in_stack_ffffffffffffffa0->namespace_,
              SUB41((uint)in_stack_ffffffffffffff9c >> 0x18,0));
  std::__cxx11::string::operator=(local_18,local_38);
  std::__cxx11::string::~string(local_38);
  if (*(long *)(local_18 + 200) == 0) {
    if (in_RSI[0x14] == (CallbackQueueInterface *)0x0) {
      pCVar2 = getGlobalCallbackQueue();
      *(CallbackQueue **)(local_18 + 200) = pCVar2;
    }
    else {
      *(CallbackQueueInterface **)(local_18 + 200) = in_RSI[0x14];
    }
  }
  std::
  make_shared<miniros::SubscriberCallbacks,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<void_const>&,miniros::CallbackQueueInterface*&>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (shared_ptr<const_void> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
             ,in_RSI);
  getTopicManager((NodeHandle *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::__shared_ptr_access<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::TopicManager,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x478bee);
  bVar1 = TopicManager::advertise(in_stack_00000688,in_stack_00000680,in_stack_00000678);
  std::shared_ptr<miniros::TopicManager>::~shared_ptr((shared_ptr<miniros::TopicManager> *)0x478c13)
  ;
  if ((bVar1 & 1) == 0) {
    Publisher::Publisher((Publisher *)0x478d4e);
  }
  else {
    Publisher::Publisher
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               &in_stack_ffffffffffffffa8->namespace_,in_stack_ffffffffffffffa0,
               (SubscriberCallbacksPtr *)
               (CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98) & 0xffffffff00ffffff))
    ;
    std::scoped_lock<std::mutex>::scoped_lock(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    __r = (shared_ptr<miniros::Publisher::Impl> *)in_RSI[0x15];
    this_00 = (vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
               *)&stack0xffffffffffffff80;
    std::weak_ptr<miniros::Publisher::Impl>::weak_ptr<miniros::Publisher::Impl,void>
              ((weak_ptr<miniros::Publisher::Impl> *)this_00,__r);
    std::
    vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
    ::push_back(this_00,(value_type *)__r);
    std::weak_ptr<miniros::Publisher::Impl>::~weak_ptr
              ((weak_ptr<miniros::Publisher::Impl> *)0x478cab);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x478cb5);
  }
  std::shared_ptr<miniros::SubscriberCallbacks>::~shared_ptr
            ((shared_ptr<miniros::SubscriberCallbacks> *)0x478d62);
  PVar3.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar3.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (Publisher)
         PVar3.impl_.super___shared_ptr<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Publisher NodeHandle::advertise(AdvertiseOptions& ops)
{
  ops.topic = resolveName(ops.topic);
  if (ops.callback_queue == 0)
  {
    if (callback_queue_)
    {
      ops.callback_queue = callback_queue_;
    }
    else
    {
      ops.callback_queue = getGlobalCallbackQueue();
    }
  }

  SubscriberCallbacksPtr callbacks(std::make_shared<SubscriberCallbacks>(ops.connect_cb, ops.disconnect_cb, 
                                                                           ops.tracked_object, ops.callback_queue));

  if (getTopicManager()->advertise(ops, callbacks))
  {
    Publisher pub(ops.topic, ops.md5sum, ops.datatype, *this, callbacks);

    {
      std::scoped_lock<std::mutex> lock(collection_->mutex_);
      collection_->pubs_.push_back(pub.impl_);
    }

    return pub;
  }

  return Publisher();
}